

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textureinfo.h
# Opt level: O0

bool __thiscall DDSHeader::LoadHeader(DDSHeader *this,ifstream *file,string *error_string)

{
  uint uVar1;
  string *psVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  int local_3c;
  undefined1 auStack_38 [3];
  bool has_dx10_header;
  uint32_t identifier;
  __mbstate_t local_30;
  string *local_28;
  string *error_string_local;
  ifstream *file_local;
  DDSHeader *this_local;
  
  local_28 = error_string;
  error_string_local = (string *)file;
  file_local = (ifstream *)this;
  uVar4 = std::ios::operator!((ios *)(file + *(long *)(*(long *)file + -0x18)));
  psVar2 = error_string_local;
  if ((uVar4 & 1) == 0) {
    std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)auStack_38,0);
    std::istream::seekg(psVar2,_auStack_38,local_30);
    std::istream::read((char *)error_string_local,(long)&local_3c);
    if (local_3c == 0x20534444) {
      bVar5 = false;
      if (((this->impl_).pixel_format.flags & 4) != 0) {
        uVar1 = (this->impl_).pixel_format.fourcc;
        uVar3 = MakeFourCC('D','X','1','0');
        bVar5 = uVar1 == uVar3;
      }
      if (bVar5) {
        std::istream::read((char *)error_string_local,(long)&this->dx10_impl_);
      }
      std::istream::read((char *)error_string_local,(long)&this->impl_);
      std::ifstream::close();
      this_local._7_1_ = true;
    }
    else {
      std::__cxx11::string::operator=
                ((string *)local_28,"Header does not contain a valid DDS identifier");
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

virtual bool LoadHeader(std::ifstream& file, std::string& error_string) {
    HEADER_PRE_LOAD(file)
    std::uint32_t identifier;
    file.read(reinterpret_cast<char*>(&identifier), sizeof(identifier));
    if(identifier != DDSInfo::kIdentifier) {
      error_string = "Header does not contain a valid DDS identifier";
      return false;
    }
    bool has_dx10_header = (impl_.pixel_format.flags & DDSInfo::e_fourCC) &&
	                     impl_.pixel_format.fourcc == MakeFourCC('D', 'X', '1', '0');
    if(has_dx10_header)
      file.read(reinterpret_cast<char*>(&this->dx10_impl_), sizeof(this->dx10_impl_));
    file.read(reinterpret_cast<char*>(&this->impl_), sizeof(this->impl_));
    HEADER_POST_LOAD(file)
  }